

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

void __thiscall
matchit::impl::IdBlock<mathiu::impl::Union>::~IdBlock(IdBlock<mathiu::impl::Union> *this)

{
  IdBlock<mathiu::impl::Union> *this_local;
  
  IdBlockBase<mathiu::impl::Union>::~IdBlockBase(&this->super_IdBlockBase<mathiu::impl::Union>);
  return;
}

Assistant:

constexpr auto hasValue() const
            {
                return std::visit(overload([](Type const &)
                                            { return true; },
                                            [](Type const *)
                                            { return true; },
                                            // [](Type *)
                                            // { return true; },
                                            [](std::monostate const &)
                                            { return false; }),
                                    IdBlockBase<Type>::mVariant);
            }